

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateGLImpl::ValidateShaderResources
          (PipelineStateGLImpl *this,shared_ptr<const_Diligent::ShaderResourcesGL> *pShaderResources
          ,char *ShaderName,SHADER_TYPE ShaderStages)

{
  undefined1 uVar1;
  ShaderResourcesGL *this_00;
  GLResourceAttribs *pGVar2;
  TextureInfo *Attribs;
  ImageInfo *Attribs_00;
  SHADER_RESOURCE_TYPE AltResourceType;
  Uint32 UVar3;
  anon_class_24_3_205b5413 HandleResource;
  anon_class_24_3_205b5413 local_50;
  char *local_38;
  SHADER_TYPE local_2c;
  
  local_50.ShaderName = &local_38;
  local_50.ShaderStages = &local_2c;
  this_00 = (pShaderResources->
            super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr;
  local_50.this = this;
  local_38 = ShaderName;
  local_2c = ShaderStages;
  if (this_00->m_NumUniformBuffers != 0) {
    UVar3 = 0;
    do {
      pGVar2 = &ShaderResourcesGL::GetUniformBuffer(this_00,UVar3)->super_GLResourceAttribs;
      ValidateShaderResources::anon_class_24_3_205b5413::operator()
                (&local_50,pGVar2,pGVar2->ResourceType);
      UVar3 = UVar3 + 1;
    } while (UVar3 < this_00->m_NumUniformBuffers);
  }
  if (this_00->m_NumTextures != 0) {
    UVar3 = 0;
    do {
      Attribs = ShaderResourcesGL::GetTexture(this_00,UVar3);
      uVar1 = (Attribs->super_GLResourceAttribs).ResourceType;
      AltResourceType = SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT;
      if (uVar1 != SHADER_RESOURCE_TYPE_TEXTURE_SRV) {
        AltResourceType = uVar1;
      }
      ValidateShaderResources::anon_class_24_3_205b5413::operator()
                (&local_50,&Attribs->super_GLResourceAttribs,AltResourceType);
      UVar3 = UVar3 + 1;
    } while (UVar3 < this_00->m_NumTextures);
  }
  if (this_00->m_NumImages != 0) {
    UVar3 = 0;
    do {
      Attribs_00 = ShaderResourcesGL::GetImage(this_00,UVar3);
      ValidateShaderResources::anon_class_24_3_205b5413::operator()
                (&local_50,&Attribs_00->super_GLResourceAttribs,
                 (Attribs_00->super_GLResourceAttribs).ResourceType ==
                 SHADER_RESOURCE_TYPE_TEXTURE_UAV ^ SHADER_RESOURCE_TYPE_BUFFER_SRV);
      UVar3 = UVar3 + 1;
    } while (UVar3 < this_00->m_NumImages);
  }
  if (this_00->m_NumStorageBlocks != 0) {
    UVar3 = 0;
    do {
      pGVar2 = &ShaderResourcesGL::GetStorageBlock(this_00,UVar3)->super_GLResourceAttribs;
      ValidateShaderResources::anon_class_24_3_205b5413::operator()
                (&local_50,pGVar2,SHADER_RESOURCE_TYPE_BUFFER_SRV);
      UVar3 = UVar3 + 1;
    } while (UVar3 < this_00->m_NumStorageBlocks);
  }
  std::
  vector<std::shared_ptr<Diligent::ShaderResourcesGL_const>,std::allocator<std::shared_ptr<Diligent::ShaderResourcesGL_const>>>
  ::emplace_back<std::shared_ptr<Diligent::ShaderResourcesGL_const>>
            ((vector<std::shared_ptr<Diligent::ShaderResourcesGL_const>,std::allocator<std::shared_ptr<Diligent::ShaderResourcesGL_const>>>
              *)&this->m_ShaderResources,pShaderResources);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::emplace_back<char_const*&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->m_ShaderNames,&local_38);
  return;
}

Assistant:

void PipelineStateGLImpl::ValidateShaderResources(std::shared_ptr<const ShaderResourcesGL> pShaderResources, const char* ShaderName, SHADER_TYPE ShaderStages)
{
    const auto HandleResource = [&](const ShaderResourcesGL::GLResourceAttribs& Attribs,
                                    SHADER_RESOURCE_TYPE                        AltResourceType) //
    {
        const auto ResAttribution = GetResourceAttribution(Attribs.Name, ShaderStages);

#ifdef DILIGENT_DEVELOPMENT
        m_ResourceAttibutions.emplace_back(ResAttribution);
#endif

        if (!ResAttribution)
        {
            LOG_ERROR_AND_THROW("Shader '", ShaderName, "' contains resource '", Attribs.Name,
                                "' that is not present in any pipeline resource signature used to create pipeline state '",
                                m_Desc.Name, "'.");
        }

        const auto* const pSignature = ResAttribution.pSignature;
        VERIFY_EXPR(pSignature != nullptr);

        if (ResAttribution.ResourceIndex != ResourceAttribution::InvalidResourceIndex)
        {
            const auto& ResDesc = pSignature->GetResourceDesc(ResAttribution.ResourceIndex);

            // Shader reflection does not contain read-only flag, so image and storage buffer can be UAV or SRV.
            // Texture SRV is the same as input attachment.
            const auto Type = (AltResourceType == ResDesc.ResourceType ? AltResourceType : Attribs.ResourceType);

            ValidatePipelineResourceCompatibility(ResDesc, Type, Attribs.ResourceFlags, Attribs.ArraySize, ShaderName, pSignature->GetDesc().Name);
        }
        else
        {
            UNEXPECTED("Resource index should be valid");
        }
    };

    const auto HandleUB = [&](const ShaderResourcesGL::UniformBufferInfo& Attribs) {
        HandleResource(Attribs, Attribs.ResourceType);
    };

    const auto HandleTexture = [&](const ShaderResourcesGL::TextureInfo& Attribs) {
        const bool IsTexelBuffer = (Attribs.ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_SRV);
        HandleResource(Attribs, IsTexelBuffer ? Attribs.ResourceType : SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT);
    };

    const auto HandleImage = [&](const ShaderResourcesGL::ImageInfo& Attribs) {
        const bool IsImageBuffer = (Attribs.ResourceType != SHADER_RESOURCE_TYPE_TEXTURE_UAV);
        HandleResource(Attribs, IsImageBuffer ? SHADER_RESOURCE_TYPE_BUFFER_SRV : SHADER_RESOURCE_TYPE_TEXTURE_SRV);
    };

    const auto HandleSB = [&](const ShaderResourcesGL::StorageBlockInfo& Attribs) {
        HandleResource(Attribs, SHADER_RESOURCE_TYPE_BUFFER_SRV);
    };

    pShaderResources->ProcessConstResources(HandleUB, HandleTexture, HandleImage, HandleSB);

#ifdef DILIGENT_DEVELOPMENT
    m_ShaderResources.emplace_back(std::move(pShaderResources));
    m_ShaderNames.emplace_back(ShaderName);
#endif
}